

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Refal2::CParser::parsingDirective(CParser *this)

{
  CDirectiveParser::AddToken(&this->super_CDirectiveParser);
  checkFinished(this);
  return;
}

Assistant:

void CParser::parsingDirective()
{
	CDirectiveParser::AddToken();
	checkFinished();
}